

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrecheckPass.cpp
# Opt level: O1

PreservedAnalyses * __thiscall
Precheck::run(PreservedAnalyses *__return_storage_ptr__,Precheck *this,Function *F,
             FunctionAnalysisManager *FM)

{
  NodeKind NVar1;
  char cVar2;
  undefined8 *puVar3;
  NodeKind LHSKind;
  undefined8 *extraout_RDX;
  char *Str;
  undefined8 *puVar4;
  NodeKind NVar5;
  PreservedAnalyses *__return_storage_ptr___00;
  undefined8 *puVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  undefined4 uVar14;
  StringRef SVar15;
  Child LHS;
  Child RHS;
  StringRef local_a0;
  Twine local_90;
  Twine local_68;
  
  SVar15.Length = (size_t)"shellvm-main";
  SVar15.Data = (char *)F;
  cVar2 = llvm::Function::hasFnAttribute(SVar15);
  if (cVar2 == '\0') {
    if ((*(uint *)(F + 0x20) & 0xc0) == 0) goto LAB_00114608;
    local_a0 = (StringRef)llvm::Value::getName();
    llvm::operator+(&local_68,"Function ",&local_a0);
    Str = " is not marked as unnamed_addr!";
  }
  else {
    if ((*(uint *)(F + 0x20) & 0xc0) == 0x40) {
LAB_00114608:
      llvm::PreservedAnalyses::all();
      return __return_storage_ptr__;
    }
    local_a0 = (StringRef)llvm::Value::getName();
    llvm::operator+(&local_68,"SheLLVM main function ",&local_a0);
    Str = " is not marked as local_unnamed_addr!";
  }
  llvm::Twine::Twine(&local_90,Str);
  __return_storage_ptr___00 = (PreservedAnalyses *)&stack0xffffffffffffffc0;
  llvm::operator+((Twine *)__return_storage_ptr___00,&local_68,&local_90);
  puVar4 = (undefined8 *)0x1;
  llvm::report_fatal_error((Twine *)__return_storage_ptr___00,true);
  NVar5 = *(NodeKind *)(puVar4 + 4);
  if ((NVar5 == NullKind) || (NVar1 = *(NodeKind *)(extraout_RDX + 4), NVar1 == NullKind)) {
    *(undefined2 *)(__return_storage_ptr___00->PreservedIDs).SmallStorage = 0x100;
  }
  else {
    if (NVar5 == EmptyKind) {
      (__return_storage_ptr___00->PreservedIDs).SmallStorage[0] = (void *)extraout_RDX[4];
      uVar7 = *(undefined4 *)extraout_RDX;
      uVar8 = *(undefined4 *)((long)extraout_RDX + 4);
      uVar9 = *(undefined4 *)(extraout_RDX + 1);
      uVar10 = *(undefined4 *)((long)extraout_RDX + 0xc);
      uVar11 = *(uint *)(extraout_RDX + 2);
      uVar12 = *(uint *)((long)extraout_RDX + 0x14);
      uVar13 = *(uint *)(extraout_RDX + 3);
      uVar14 = *(undefined4 *)((long)extraout_RDX + 0x1c);
    }
    else {
      if (NVar1 != EmptyKind) {
        puVar3 = puVar4;
        LHSKind = TwineKind;
        if (*(char *)((long)puVar4 + 0x21) == '\x01') {
          puVar3 = (undefined8 *)*puVar4;
          LHSKind = NVar5;
        }
        puVar6 = extraout_RDX;
        NVar5 = TwineKind;
        if (*(char *)((long)extraout_RDX + 0x21) == '\x01') {
          puVar6 = (undefined8 *)*extraout_RDX;
          NVar5 = NVar1;
        }
        LHS.ptrAndLength.length = puVar4[1];
        LHS.decUL = puVar3;
        RHS.ptrAndLength.length = extraout_RDX[1];
        RHS.decUL = puVar6;
        llvm::Twine::Twine((Twine *)__return_storage_ptr___00,LHS,LHSKind,RHS,NVar5);
        return __return_storage_ptr___00;
      }
      (__return_storage_ptr___00->PreservedIDs).SmallStorage[0] = (void *)puVar4[4];
      uVar7 = *(undefined4 *)puVar4;
      uVar8 = *(undefined4 *)((long)puVar4 + 4);
      uVar9 = *(undefined4 *)(puVar4 + 1);
      uVar10 = *(undefined4 *)((long)puVar4 + 0xc);
      uVar11 = *(uint *)(puVar4 + 2);
      uVar12 = *(uint *)((long)puVar4 + 0x14);
      uVar13 = *(uint *)(puVar4 + 3);
      uVar14 = *(undefined4 *)((long)puVar4 + 0x1c);
    }
    (__return_storage_ptr___00->PreservedIDs).super_SmallPtrSetImpl<void_*>.
    super_SmallPtrSetImplBase.CurArraySize = uVar11;
    (__return_storage_ptr___00->PreservedIDs).super_SmallPtrSetImpl<void_*>.
    super_SmallPtrSetImplBase.NumNonEmpty = uVar12;
    (__return_storage_ptr___00->PreservedIDs).super_SmallPtrSetImpl<void_*>.
    super_SmallPtrSetImplBase.NumTombstones = uVar13;
    *(undefined4 *)
     &(__return_storage_ptr___00->PreservedIDs).super_SmallPtrSetImpl<void_*>.
      super_SmallPtrSetImplBase.field_0x1c = uVar14;
    *(undefined4 *)
     &(__return_storage_ptr___00->PreservedIDs).super_SmallPtrSetImpl<void_*>.
      super_SmallPtrSetImplBase.SmallArray = uVar7;
    *(undefined4 *)
     ((long)&(__return_storage_ptr___00->PreservedIDs).super_SmallPtrSetImpl<void_*>.
             super_SmallPtrSetImplBase.SmallArray + 4) = uVar8;
    *(undefined4 *)
     &(__return_storage_ptr___00->PreservedIDs).super_SmallPtrSetImpl<void_*>.
      super_SmallPtrSetImplBase.CurArray = uVar9;
    *(undefined4 *)
     ((long)&(__return_storage_ptr___00->PreservedIDs).super_SmallPtrSetImpl<void_*>.
             super_SmallPtrSetImplBase.CurArray + 4) = uVar10;
  }
  return __return_storage_ptr___00;
}

Assistant:

llvm::PreservedAnalyses Precheck::run(Function &F,
                                      FunctionAnalysisManager &FM) {
  if (!F.hasFnAttribute("shellvm-main")) {
    if (F.getUnnamedAddr() != GlobalValue::UnnamedAddr::None) {
      report_fatal_error("Function " + F.getName() +
                         " is not marked as unnamed_addr!");
    }
  } else {
    if (F.getUnnamedAddr() != GlobalValue::UnnamedAddr::Local) {
      report_fatal_error("SheLLVM main function " + F.getName() +
                         " is not marked as local_unnamed_addr!");
    }
  }

  return PreservedAnalyses::all();
}